

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O1

int bip32_key_init(uint32_t version,uint32_t depth,uint32_t child_num,uchar *chain_code,
                  size_t chain_code_len,uchar *pub_key,size_t pub_key_len,uchar *priv_key,
                  size_t priv_key_len,uchar *hash160,size_t hash160_len,uchar *parent160,
                  size_t parent160_len,ext_key *key_out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  
  iVar4 = -2;
  if (key_out == (ext_key *)0x0) {
    return -2;
  }
  if ((int)version < 0x488ade4) {
    if (version != 0x4358394) {
      if (version != 0x43587cf) goto LAB_0015a108;
      goto LAB_0015a0f0;
    }
LAB_0015a0e3:
    bVar5 = priv_key == (uchar *)0x0;
    bVar6 = priv_key_len == 0x20;
  }
  else {
    if (version != 0x488b21e) {
      if (version != 0x488ade4) goto LAB_0015a108;
      goto LAB_0015a0e3;
    }
LAB_0015a0f0:
    bVar5 = pub_key == (uchar *)0x0;
    bVar6 = pub_key_len == 0x21;
  }
  if ((bool)(!bVar6 | bVar5)) {
    return -2;
  }
LAB_0015a108:
  if ((((chain_code_len == 0x20 && chain_code != (uchar *)0x0) &&
       (priv_key == (uchar *)0x0 || priv_key_len == 0x20)) &&
      (priv_key != (uchar *)0x0 || priv_key_len == 0)) &&
     (((pub_key == (uchar *)0x0 || pub_key_len == 0x21 &&
       (pub_key != (uchar *)0x0 || pub_key_len == 0)) &&
      ((hash160 == (uchar *)0x0 || hash160_len == 0x14 &&
       ((hash160 != (uchar *)0x0 || hash160_len == 0 &&
        (parent160 == (uchar *)0x0 || (parent160_len & 0xffffffffffffffef) == 4)))))))) {
    if ((depth < 0x100) && (parent160 != (uchar *)0x0 || parent160_len == 0)) {
      wally_clear(key_out,0xc0);
      key_out->version = version;
      key_out->depth = (uint8_t)depth;
      key_out->child_num = child_num;
      uVar1 = *(undefined8 *)(chain_code + 8);
      uVar2 = *(undefined8 *)(chain_code + 0x10);
      uVar3 = *(undefined8 *)(chain_code + 0x18);
      *(undefined8 *)key_out->chain_code = *(undefined8 *)chain_code;
      *(undefined8 *)(key_out->chain_code + 8) = uVar1;
      *(undefined8 *)(key_out->chain_code + 0x10) = uVar2;
      *(undefined8 *)(key_out->chain_code + 0x18) = uVar3;
      if (((priv_key == (uchar *)0x0) || (version == 0x43587cf)) || (version == 0x488b21e)) {
        key_out->priv_key[0] = '\x01';
      }
      else {
        uVar1 = *(undefined8 *)priv_key;
        uVar2 = *(undefined8 *)(priv_key + 8);
        uVar3 = *(undefined8 *)(priv_key + 0x18);
        *(undefined8 *)(key_out->priv_key + 0x11) = *(undefined8 *)(priv_key + 0x10);
        *(undefined8 *)(key_out->priv_key + 0x19) = uVar3;
        *(undefined8 *)(key_out->priv_key + 1) = uVar1;
        *(undefined8 *)(key_out->priv_key + 9) = uVar2;
      }
      if (pub_key == (uchar *)0x0) {
        if (((version == 0x488ade4) || (version == 0x4358394)) &&
           (iVar4 = wally_ec_public_key_from_private_key
                              (key_out->priv_key + 1,0x20,key_out->pub_key,0x21), iVar4 != 0)) {
          wally_clear(key_out,0xc0);
          return iVar4;
        }
      }
      else {
        key_out->pub_key[0x20] = pub_key[0x20];
        uVar1 = *(undefined8 *)pub_key;
        uVar2 = *(undefined8 *)(pub_key + 8);
        uVar3 = *(undefined8 *)(pub_key + 0x18);
        *(undefined8 *)(key_out->pub_key + 0x10) = *(undefined8 *)(pub_key + 0x10);
        *(undefined8 *)(key_out->pub_key + 0x18) = uVar3;
        *(undefined8 *)key_out->pub_key = uVar1;
        *(undefined8 *)(key_out->pub_key + 8) = uVar2;
      }
      if (hash160 == (uchar *)0x0) {
        wally_hash160(key_out->pub_key,0x21,key_out->hash160,0x14);
      }
      else {
        *(undefined4 *)(key_out->hash160 + 0x10) = *(undefined4 *)(hash160 + 0x10);
        uVar1 = *(undefined8 *)(hash160 + 8);
        *(undefined8 *)key_out->hash160 = *(undefined8 *)hash160;
        *(undefined8 *)(key_out->hash160 + 8) = uVar1;
      }
      iVar4 = 0;
      if (parent160 != (uchar *)0x0) {
        memcpy(key_out->parent160,parent160,parent160_len);
      }
    }
  }
  return iVar4;
}

Assistant:

int bip32_key_init(uint32_t version, uint32_t depth, uint32_t child_num,
                   const unsigned char *chain_code, size_t chain_code_len,
                   const unsigned char *pub_key, size_t pub_key_len,
                   const unsigned char *priv_key, size_t priv_key_len,
                   const unsigned char *hash160, size_t hash160_len,
                   const unsigned char *parent160, size_t parent160_len,
                   struct ext_key *key_out)
{
    if (!key_out)
        return WALLY_EINVAL;

    switch (version) {
    case BIP32_VER_MAIN_PRIVATE:
    case BIP32_VER_TEST_PRIVATE:
        if (!priv_key || priv_key_len != key_size(priv_key) - 1)
            return WALLY_EINVAL;
        break;
    case BIP32_VER_MAIN_PUBLIC:
    case BIP32_VER_TEST_PUBLIC:
        if (!pub_key || pub_key_len != key_size(pub_key))
            return WALLY_EINVAL;
        break;
    }

    if (!chain_code || chain_code_len != key_size(chain_code))
        return WALLY_EINVAL;

    if ((priv_key && priv_key_len != key_size(priv_key) - 1) || (!priv_key && priv_key_len) ||
        (pub_key && pub_key_len != key_size(pub_key)) || (!pub_key && pub_key_len) ||
        (hash160 && hash160_len != key_size(hash160)) || (!hash160 && hash160_len) ||
        (parent160 && !is_valid_parent160_len(parent160_len)) ||
        (!parent160 && parent160_len) || depth > 0xff)
        return WALLY_EINVAL;

    wally_clear(key_out, sizeof(*key_out));
    key_out->version = version;
    key_out->depth = depth;
    key_out->child_num = child_num;

    memcpy(key_out->chain_code, chain_code, key_size(chain_code));
    if (priv_key && version != BIP32_VER_MAIN_PUBLIC && version != BIP32_VER_TEST_PUBLIC)
        memcpy(key_out->priv_key + 1, priv_key, key_size(priv_key) - 1);
    else
        key_out->priv_key[0] = BIP32_FLAG_KEY_PUBLIC;
    if (pub_key)
        memcpy(key_out->pub_key, pub_key, key_size(pub_key));
    else if (version == BIP32_VER_MAIN_PRIVATE || version == BIP32_VER_TEST_PRIVATE) {
        /* Compute the public key if not given */
        int ret = key_compute_pub_key(key_out);
        if (ret != WALLY_OK) {
            wally_clear(key_out, sizeof(*key_out));
            return ret;
        }
    }
    if (hash160)
        memcpy(key_out->hash160, hash160, key_size(hash160));
    else
        key_compute_hash160(key_out);
    if (parent160)
        memcpy(key_out->parent160, parent160, parent160_len);

    return WALLY_OK;
}